

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool __thiscall
EOPlus::Context::TriggerRule
          (Context *this,string *rule,
          function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
          *arg_check)

{
  State *pSVar1;
  _Elt_pointer pRVar2;
  __type _Var3;
  bool bVar4;
  _Elt_pointer pRVar5;
  _Elt_pointer pRVar6;
  Rule check_rule;
  _Map_pointer local_290;
  Rule local_278;
  
  pSVar1 = this->state;
  if (pSVar1 != (State *)0x0) {
    pRVar5 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pRVar6 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    local_290 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    pRVar2 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    while (pRVar5 != pRVar2) {
      Rule::Rule(&local_278,pRVar5);
      _Var3 = std::operator==(&local_278.expr.function,rule);
      if ((_Var3) &&
         (bVar4 = std::
                  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                  ::operator()(arg_check,&local_278.expr.args), bVar4)) {
        (*this->_vptr_Context[1])(this,&local_278.action);
        Rule::~Rule(&local_278);
        return true;
      }
      Rule::~Rule(&local_278);
      pRVar5 = pRVar5 + 1;
      if (pRVar5 == pRVar6) {
        pRVar5 = local_290[1];
        local_290 = local_290 + 1;
        pRVar6 = pRVar5 + 1;
      }
    }
  }
  return false;
}

Assistant:

bool Context::TriggerRule(std::string rule, std::function<bool(const std::deque<util::variant>&)> arg_check)
	{
		if (!this->state)
			return false;

		UTIL_FOREACH(this->state->rules, check_rule)
		{
			if (check_rule.expr.function == rule && arg_check(check_rule.expr.args))
			{
				this->DoAction(check_rule.action);
				// *this may not be valid here
				return true;
			}
		}

		return false;
	}